

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_factory.h
# Opt level: O0

void __thiscall
linux_util::canvas_factory<(linux_util::screen_t)0>::vline
          (canvas_factory<(linux_util::screen_t)0> *this,size_t x,size_t y,size_t height)

{
  size_t i;
  size_t height_local;
  size_t y_local;
  size_t x_local;
  canvas_factory<(linux_util::screen_t)0> *this_local;
  
  y_local = x + (this->vinfo).xres * y;
  for (i = 0; i < height; i = i + 1) {
    *(pixel_t *)(this->screen1 + y_local * 4) = this->colour;
    y_local = (this->vinfo).xres + y_local;
  }
  return;
}

Assistant:

void vline(size_t x, size_t y, size_t height)  {
            y *= vinfo.xres;
            y += x;
            for(size_t i{0}; i < height; ++i) {
                ((pixel_t *) (screen1))[y] = colour;
                y += vinfo.xres;
            }
        }